

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::skip<(anonymous_namespace)::CharIO,std::istream>
               (basic_istream<char,_std::char_traits<char>_> *in,int n)

{
  char c [1024];
  undefined1 auStack_408 [1032];
  
  if (0 < n) {
    std::istream::read((char *)in,(long)auStack_408);
  }
  return;
}

Assistant:

void
skip (T &in, int n)			// skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
	if (!S::readChars (in, c, sizeof (c)))
	    return;

	n -= sizeof (c);
    }

    if (n >= 1)
	S::readChars (in, c, n);
}